

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_typeid(runtime_type *this,var *b)

{
  bool bVar1;
  type_info *ptVar2;
  type_t *ptVar3;
  structure *psVar4;
  any *in_RDX;
  type_id *dat;
  
  ptVar2 = cs_impl::any::type(in_RDX);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&type_t::typeinfo);
  if (bVar1) {
    ptVar3 = cs_impl::any::const_val<cs::type_t>(in_RDX);
    dat = &ptVar3->id;
  }
  else {
    ptVar2 = cs_impl::any::type(in_RDX);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&structure::typeinfo);
    if (!bVar1) {
      ptVar2 = cs_impl::any::type(in_RDX);
      cs_impl::any::make<cs::type_id,std::type_info_const&>((any *)this,ptVar2);
      return (var)(proxy *)this;
    }
    psVar4 = cs_impl::any::const_val<cs::structure>(in_RDX);
    dat = &psVar4->m_id;
  }
  cs_impl::any::any<cs::type_id>((any *)this,dat);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_typeid(const var &b)
	{
		if (b.type() == typeid(type_t))
			return b.const_val<type_t>().id;
		else if (b.type() == typeid(structure))
			return b.const_val<structure>().get_id();
		else
			return var::make<type_id>(b.type());
	}